

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,FormattedBytes *FB)

{
  FormattedBytes FVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uchar *puVar5;
  size_type sVar6;
  uchar UC;
  uchar C;
  ulong uVar7;
  unsigned_long *puVar8;
  uint64_t uVar9;
  byte *pbVar10;
  uint uVar11;
  undefined8 in_R9;
  size_type sVar12;
  ulong uVar13;
  size_t I;
  long lVar14;
  ulong uVar15;
  Optional<unsigned_long> Width;
  Optional<unsigned_long> Width_00;
  ArrayRef<unsigned_char> Line;
  ArrayRef<unsigned_char> local_68;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  FormattedBytes *local_40;
  ulong local_38;
  
  if (*(long *)(FB + 8) != 0) {
    uVar13 = *(ulong *)(FB + 8);
    local_68 = *(ArrayRef<unsigned_char> *)FB;
    FVar1 = FB[0x29];
    local_40 = FB + 0x10;
    uVar9 = (uint64_t)*(uint *)(FB + 0x24);
    if (FB[0x18] == (FormattedBytes)0x1) {
      uVar7 = uVar13 / uVar9;
      puVar8 = Optional<unsigned_long>::getPointer((Optional<unsigned_long> *)local_40);
      uVar9 = (uint64_t)*(uint *)(FB + 0x24);
      lVar14 = uVar7 * uVar9 + *puVar8;
      uVar7 = lVar14 - 1;
      if (uVar7 == 0) {
        uVar11 = 0x40;
      }
      else {
        lVar3 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar11 = (uint)lVar3 ^ 0x3f;
      }
      local_58 = (ulong)(0x43 - uVar11 >> 2);
      if (local_58 < 5) {
        local_58 = 4;
      }
      if (lVar14 == 0) {
        local_58 = 4;
      }
    }
    else {
      local_58 = 0;
    }
    uVar15 = 0;
    uVar9 = alignTo(uVar9,(ulong)(byte)FB[0x28],0);
    iVar2 = *(int *)(FB + 0x24);
    iVar4 = (int)(uVar9 / (byte)FB[0x28]);
    local_48 = (ulong)((iVar4 + iVar2 * 2) - 1);
    uVar7 = uVar13;
    local_50 = uVar13;
    while (uVar7 != 0) {
      indent(this,*(uint *)(FB + 0x20));
      if (FB[0x18] == (FormattedBytes)0x1) {
        puVar8 = Optional<unsigned_long>::getPointer((Optional<unsigned_long> *)local_40);
        Width.Storage._8_8_ = in_R9;
        Width.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
             (AlignedCharArray<8UL,_8UL>)0x1;
        llvm::write_hex((llvm *)this,(raw_ostream *)(*puVar8 + uVar15),(ulong)((byte)FVar1 ^ 1),
                        (HexPrintStyle)local_58,Width);
        operator<<(this,": ");
      }
      local_38 = uVar15;
      Line = ArrayRef<unsigned_char>::take_front(&local_68,(ulong)*(uint *)(FB + 0x24));
      uVar7 = 0;
      for (uVar15 = 0; uVar15 < Line.Length; uVar15 = uVar15 + 1) {
        if ((uVar15 != 0) && (uVar15 % (ulong)(byte)FB[0x28] == 0)) {
          uVar7 = uVar7 + 1;
          operator<<(this," ");
        }
        pbVar10 = ArrayRef<unsigned_char>::operator[](&Line,uVar15);
        Width_00.Storage._8_8_ = in_R9;
        Width_00.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
             (AlignedCharArray<8UL,_8UL>)0x1;
        llvm::write_hex((llvm *)this,(raw_ostream *)(ulong)*pbVar10,(ulong)((byte)FVar1 ^ 1),
                        PrefixUpper,Width_00);
        uVar7 = uVar7 + 2;
      }
      uVar15 = Line.Length;
      if (FB[0x2a] != (FormattedBytes)0x0) {
        if (local_48 < uVar7) {
          __assert_fail("BlockCharWidth >= CharsPrinted",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                        ,0x1b1,"raw_ostream &llvm::raw_ostream::operator<<(const FormattedBytes &)")
          ;
        }
        indent(this,(iVar4 + 1 + iVar2 * 2) - (int)uVar7);
        operator<<(this,"|");
        puVar5 = Line.Data;
        sVar6 = Line.Length;
        for (sVar12 = 0; sVar6 != sVar12; sVar12 = sVar12 + 1) {
          C = puVar5[sVar12];
          if (0x5e < (byte)(C - 0x20)) {
            C = '.';
          }
          operator<<(this,C);
        }
        operator<<(this,'|');
        uVar15 = Line.Length;
        uVar13 = local_50;
      }
      local_68 = ArrayRef<unsigned_char>::drop_front(&local_68,uVar15);
      uVar15 = local_38 + Line.Length;
      uVar7 = local_68.Length;
      if (uVar15 < uVar13) {
        operator<<(this,'\n');
        uVar7 = local_68.Length;
      }
    }
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const FormattedBytes &FB) {
  if (FB.Bytes.empty())
    return *this;

  size_t LineIndex = 0;
  auto Bytes = FB.Bytes;
  const size_t Size = Bytes.size();
  HexPrintStyle HPS = FB.Upper ? HexPrintStyle::Upper : HexPrintStyle::Lower;
  uint64_t OffsetWidth = 0;
  if (FB.FirstByteOffset.hasValue()) {
    // Figure out how many nibbles are needed to print the largest offset
    // represented by this data set, so that we can align the offset field
    // to the right width.
    size_t Lines = Size / FB.NumPerLine;
    uint64_t MaxOffset = *FB.FirstByteOffset + Lines * FB.NumPerLine;
    unsigned Power = 0;
    if (MaxOffset > 0)
      Power = llvm::Log2_64_Ceil(MaxOffset);
    OffsetWidth = std::max<uint64_t>(4, llvm::alignTo(Power, 4) / 4);
  }

  // The width of a block of data including all spaces for group separators.
  unsigned NumByteGroups =
      alignTo(FB.NumPerLine, FB.ByteGroupSize) / FB.ByteGroupSize;
  unsigned BlockCharWidth = FB.NumPerLine * 2 + NumByteGroups - 1;

  while (!Bytes.empty()) {
    indent(FB.IndentLevel);

    if (FB.FirstByteOffset.hasValue()) {
      uint64_t Offset = FB.FirstByteOffset.getValue();
      llvm::write_hex(*this, Offset + LineIndex, HPS, OffsetWidth);
      *this << ": ";
    }

    auto Line = Bytes.take_front(FB.NumPerLine);

    size_t CharsPrinted = 0;
    // Print the hex bytes for this line in groups
    for (size_t I = 0; I < Line.size(); ++I, CharsPrinted += 2) {
      if (I && (I % FB.ByteGroupSize) == 0) {
        ++CharsPrinted;
        *this << " ";
      }
      llvm::write_hex(*this, Line[I], HPS, 2);
    }

    if (FB.ASCII) {
      // Print any spaces needed for any bytes that we didn't print on this
      // line so that the ASCII bytes are correctly aligned.
      assert(BlockCharWidth >= CharsPrinted);
      indent(BlockCharWidth - CharsPrinted + 2);
      *this << "|";

      // Print the ASCII char values for each byte on this line
      for (uint8_t Byte : Line) {
        if (isPrint(Byte))
          *this << static_cast<char>(Byte);
        else
          *this << '.';
      }
      *this << '|';
    }

    Bytes = Bytes.drop_front(Line.size());
    LineIndex += Line.size();
    if (LineIndex < Size)
      *this << '\n';
  }
  return *this;
}